

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O2

bool __thiscall Am_Priority_List::Member(Am_Priority_List *this,Am_Object *obj)

{
  Am_Priority_List_Item *pAVar1;
  bool bVar2;
  Am_Priority_List_Item *this_00;
  
  pAVar1 = this->current;
  this_00 = pAVar1;
  while (this_00 != (Am_Priority_List_Item *)0x0) {
    bVar2 = Am_Object::operator==(&this_00->obj,obj);
    if (bVar2) goto LAB_0022d393;
    this_00 = this->current->next;
    this->current = this_00;
  }
  this->current = pAVar1;
LAB_0022d393:
  return this_00 != (Am_Priority_List_Item *)0x0;
}

Assistant:

bool
Am_Priority_List::Member(Am_Object obj)
{
  Am_Priority_List_Item *old_current = current;
  for (; current != nullptr; current = current->next) {
    if (current->obj == obj)
      return true;
  }
  current = old_current;
  return false;
}